

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_advection_diffusion_reaction_splitting.c
# Opt level: O2

int f_diffusion(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  int iVar2;
  double *flagvalue;
  double *flagvalue_00;
  long lVar3;
  int iVar4;
  double dVar5;
  
  flagvalue = (double *)N_VGetArrayPointer();
  iVar2 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar4 = 1;
  if (iVar2 == 0) {
    flagvalue_00 = (double *)N_VGetArrayPointer(ydot);
    iVar2 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar2 == 0) {
      dVar5 = *(double *)((long)user_data + 0x18) /
              (*(double *)((long)user_data + 8) * *(double *)((long)user_data + 8));
      *flagvalue_00 =
           ((*(double *)((long)user_data + 0x28) - (*flagvalue + *flagvalue)) + flagvalue[1]) *
           dVar5;
      lVar1 = *user_data;
      for (lVar3 = 1; lVar3 < lVar1 + -1; lVar3 = lVar3 + 1) {
        flagvalue_00[lVar3] =
             ((flagvalue[lVar3 + 1] - (flagvalue[lVar3] + flagvalue[lVar3])) + flagvalue[lVar3 + -1]
             ) * dVar5;
      }
      flagvalue_00[lVar1 + -1] =
           dVar5 * ((flagvalue[lVar1 + -2] - (flagvalue[lVar1 + -1] + flagvalue[lVar1 + -1])) +
                   *(double *)((long)user_data + 0x28));
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int f_diffusion(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData* udata = (UserData*)user_data;
  sunrealtype* Y  = NULL;
  Y               = N_VGetArrayPointer(y); /* access data arrays */
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  sunrealtype* Ydot = NULL;
  Ydot              = N_VGetArrayPointer(ydot);
  if (check_flag((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  sunrealtype coeff = udata->b / (udata->dx * udata->dx);

  /* Left boundary */
  Ydot[0] = coeff * (udata->u0 - 2 * Y[0] + Y[1]);
  /* Interior */
  for (sunindextype i = 1; i < udata->N - 1; i++)
  {
    Ydot[i] = coeff * (Y[i + 1] - 2 * Y[i] + Y[i - 1]);
  }
  /* Right boundary */
  Ydot[udata->N - 1] = coeff *
                       (Y[udata->N - 2] - 2 * Y[udata->N - 1] + udata->u0);

  return 0;
}